

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Player.cpp
# Opt level: O2

void __thiscall Player::draw(Player *this,int i)

{
  pointer *pppAVar1;
  pointer ppAVar2;
  int iVar3;
  bool bVar4;
  AEntity *tmp;
  AEntity *local_20;
  
  iVar3 = 0;
  if (0 < i) {
    iVar3 = i;
  }
  while (bVar4 = iVar3 != 0, iVar3 = iVar3 + -1, bVar4) {
    ppAVar2 = (this->_deck).super__Vector_base<AEntity_*,_std::allocator<AEntity_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (ppAVar2 !=
        (this->_deck).super__Vector_base<AEntity_*,_std::allocator<AEntity_*>_>._M_impl.
        super__Vector_impl_data._M_start) {
      local_20 = ppAVar2[-1];
      std::vector<AEntity_*,_std::allocator<AEntity_*>_>::push_back(&this->_hands,&local_20);
      pppAVar1 = &(this->_deck).super__Vector_base<AEntity_*,_std::allocator<AEntity_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      *pppAVar1 = *pppAVar1 + -1;
    }
  }
  return;
}

Assistant:

void Player::draw(int i) {
    for (int j = 0; j < i; ++j) {
        if (this->_deck.size()) {
            AEntity *tmp = this->_deck.back();
            this->_hands.push_back(tmp);
            this->_deck.pop_back();
        } else if (this->_deck.size() == 10) {
            AEntity *tmp = this->_deck.back();
            this->_played.push_back(tmp);
            this->_deck.pop_back();
        } else {
            //todo: gestion de la fatigue
        }
    }
}